

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clangs.c
# Opt level: O1

float clangs(char *norm,SuperMatrix *A)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  void *__s;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  singlecomplex *psVar9;
  long lVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  char msg [256];
  char local_138 [264];
  
  iVar1 = A->nrow;
  iVar3 = A->ncol;
  if (iVar1 < A->ncol) {
    iVar3 = iVar1;
  }
  fVar11 = 0.0;
  if (iVar3 == 0) {
    return 0.0;
  }
  pvVar2 = A->Store;
  lVar5 = *(long *)((long)pvVar2 + 8);
  switch(*norm) {
  case 'E':
  case 'F':
    pcVar6 = "Not implemented.";
    uVar4 = 0x75;
    goto LAB_00103b42;
  case 'I':
    __s = superlu_malloc((long)iVar1 << 2);
    if (__s == (void *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork.",0x67,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/clangs.c");
      superlu_abort_and_exit(local_138);
    }
    if (0 < (long)A->nrow) {
      memset(__s,0,(long)A->nrow << 2);
    }
    if (0 < A->ncol) {
      lVar7 = 0;
      do {
        iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar7 * 4);
        lVar10 = (long)iVar1;
        lVar8 = lVar7 + 1;
        if (iVar1 < *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar7 * 4)) {
          psVar9 = (singlecomplex *)(lVar5 + lVar10 * 8);
          do {
            lVar7 = (long)*(int *)(*(long *)((long)pvVar2 + 0x10) + lVar10 * 4);
            dVar12 = c_abs(psVar9);
            *(float *)((long)__s + lVar7 * 4) =
                 (float)((double)*(float *)((long)__s + lVar7 * 4) + dVar12);
            lVar10 = lVar10 + 1;
            psVar9 = psVar9 + 1;
          } while (lVar10 < *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar8 * 4));
        }
        lVar7 = lVar8;
      } while (lVar8 < A->ncol);
    }
    fVar11 = 0.0;
    if (0 < (long)A->nrow) {
      lVar5 = 0;
      do {
        fVar13 = *(float *)((long)__s + lVar5 * 4);
        if (fVar11 <= fVar13) {
          fVar11 = fVar13;
        }
        lVar5 = lVar5 + 1;
      } while (A->nrow != lVar5);
    }
    superlu_free(__s);
    break;
  case 'M':
    if (0 < A->ncol) {
      fVar11 = 0.0;
      lVar7 = 0;
      do {
        iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar7 * 4);
        lVar8 = (long)iVar1;
        lVar10 = lVar7 + 1;
        if (iVar1 < *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar7 * 4)) {
          psVar9 = (singlecomplex *)(lVar8 * 8 + lVar5);
          do {
            dVar12 = c_abs(psVar9);
            if ((double)fVar11 <= dVar12) {
              dVar12 = c_abs(psVar9);
              fVar11 = (float)dVar12;
            }
            lVar8 = lVar8 + 1;
            psVar9 = psVar9 + 1;
          } while (lVar8 < *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar10 * 4));
        }
        lVar7 = lVar10;
      } while (lVar10 < A->ncol);
    }
    break;
  case 'O':
switchD_00103a68_caseD_4f:
    if (0 < A->ncol) {
      fVar11 = 0.0;
      lVar7 = 0;
      do {
        iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar7 * 4);
        lVar8 = (long)iVar1;
        lVar10 = lVar7 + 1;
        fVar13 = 0.0;
        if (iVar1 < *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar7 * 4)) {
          psVar9 = (singlecomplex *)(lVar8 * 8 + lVar5);
          do {
            dVar12 = c_abs(psVar9);
            fVar13 = (float)((double)fVar13 + dVar12);
            lVar8 = lVar8 + 1;
            psVar9 = psVar9 + 1;
          } while (lVar8 < *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar10 * 4));
        }
        if (fVar11 <= fVar13) {
          fVar11 = fVar13;
        }
        lVar7 = lVar10;
      } while (lVar10 < A->ncol);
    }
    break;
  default:
    if (*norm == '1') goto switchD_00103a68_caseD_4f;
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'N':
    pcVar6 = "Illegal norm specified.";
    uVar4 = 0x77;
LAB_00103b42:
    sprintf(local_138,"%s at line %d in file %s\n",pcVar6,uVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/clangs.c");
    superlu_abort_and_exit(local_138);
    fVar11 = 0.0;
  }
  return fVar11;
}

Assistant:

float clangs(char *norm, SuperMatrix *A)
{
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int      i, j, irow;
    float   value = 0., sum;
    float   *rwork;

    Astore = A->Store;
    Aval   = Astore->nzval;
    
    if ( SUPERLU_MIN(A->nrow, A->ncol) == 0) {
    } else if (strncmp(norm, "M", 1)==0) {
	/* Find max(abs(A(i,j))). */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++)
		value = SUPERLU_MAX( value, c_abs( &Aval[i]) );
	
    } else if (strncmp(norm, "O", 1)==0 || *(unsigned char *)norm == '1') {
	/* Find norm1(A). */
	for (j = 0; j < A->ncol; ++j) {
	    sum = 0.;
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) 
		sum += c_abs( &Aval[i] );
	    value = SUPERLU_MAX(value,sum);
	}
	
    } else if (strncmp(norm, "I", 1)==0) {
	/* Find normI(A). */
	if ( !(rwork = (float *) SUPERLU_MALLOC(A->nrow * sizeof(float))) )
	    ABORT("SUPERLU_MALLOC fails for rwork.");
	for (i = 0; i < A->nrow; ++i) rwork[i] = 0.;
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) {
		irow = Astore->rowind[i];
		rwork[irow] += c_abs( &Aval[i] );
	    }
	for (i = 0; i < A->nrow; ++i)
	    value = SUPERLU_MAX(value, rwork[i]);
	
	SUPERLU_FREE (rwork);
	
    } else if (strncmp(norm, "F", 1)==0 || strncmp(norm, "E", 1)==0) {
	/* Find normF(A). */
	ABORT("Not implemented.");
    } else
	ABORT("Illegal norm specified.");

    return (value);

}